

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

NodeBase **
google::protobuf::Arena::CreateArray<google::protobuf::internal::NodeBase*>
          (Arena *arena,size_t num_elements)

{
  Nullable<const_char_*> failure_msg;
  NodeBase **ppNVar1;
  ulong uVar2;
  LogMessage local_30;
  unsigned_long local_20;
  
  local_20 = 0x1fffffffffffffff;
  local_30._0_8_ = num_elements;
  failure_msg = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                          ((unsigned_long *)&local_30,&local_20,
                           "num_elements <= std::numeric_limits<size_t>::max() / sizeof(T)");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    if (arena == (Arena *)0x0) {
      uVar2 = 0xffffffffffffffff;
      if (num_elements < 0x2000000000000000) {
        uVar2 = num_elements * 8;
      }
      ppNVar1 = (NodeBase **)operator_new__(uVar2);
    }
    else {
      ppNVar1 = (NodeBase **)AllocateAlignedForArray(arena,num_elements << 3,8);
    }
    return ppNVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.h"
             ,0x109,failure_msg);
  absl::lts_20250127::log_internal::LogMessage::operator<<
            (&local_30,(char (*) [48])"Requested size is too large to fit into size_t.");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* PROTOBUF_NONNULL
  CreateArray(Arena* PROTOBUF_NULLABLE arena, size_t num_elements) {
    static_assert(std::is_trivial<T>::value,
                  "CreateArray requires a trivially constructible type");
    static_assert(std::is_trivially_destructible<T>::value,
                  "CreateArray requires a trivially destructible type");
    ABSL_CHECK_LE(num_elements, std::numeric_limits<size_t>::max() / sizeof(T))
        << "Requested size is too large to fit into size_t.";
    if (ABSL_PREDICT_FALSE(arena == nullptr)) {
      return new T[num_elements];
    } else {
      // We count on compiler to realize that if sizeof(T) is a multiple of
      // 8 AlignUpTo can be elided.
      return static_cast<T*>(
          arena->AllocateAlignedForArray(sizeof(T) * num_elements, alignof(T)));
    }
  }